

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O2

void vector_insert_empty(vector v,size_t position)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  void *__dest;
  ulong uVar6;
  
  if (v != (vector)0x0) {
    if ((v->size == v->capacity) && (iVar2 = vector_reserve(v,v->size * 2), iVar2 != 0)) {
      log_write_impl_va("metacall",0x18e,"vector_insert_empty",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
    }
    uVar4 = v->size;
    if (position <= uVar4 && uVar4 - position != 0) {
      sVar1 = v->type_size;
      pvVar5 = v->data;
      if (pvVar5 == (void *)0x0) {
        __dest = (void *)0x0;
        pvVar5 = (void *)0x0;
      }
      else {
        uVar3 = sVar1 * position;
        uVar6 = v->capacity * sVar1;
        __dest = (void *)((long)pvVar5 + uVar3);
        if (uVar6 < uVar3 || uVar6 - uVar3 == 0) {
          __dest = (void *)0x0;
        }
        uVar3 = (position + 1) * sVar1;
        pvVar5 = (void *)((long)pvVar5 + uVar3);
        if (uVar6 < uVar3 || uVar6 - uVar3 == 0) {
          pvVar5 = (void *)0x0;
        }
      }
      memmove(__dest,pvVar5,sVar1 * (uVar4 - position));
      uVar4 = v->size;
    }
    v->size = uVar4 + 1;
  }
  return;
}

Assistant:

void vector_insert_empty(vector v, size_t position)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		if (position < v->size)
		{
			memmove(vector_data_offset_bytes(v, position * v->type_size),
				vector_data_offset_bytes(v, (position + 1) * v->type_size),
				(v->size - position) * v->type_size);
		}

		++v->size;
	}
}